

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_h_predictor_64x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined6 uVar4;
  undefined1 auVar5 [12];
  long lVar6;
  undefined2 uVar7;
  undefined4 uVar8;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 uVar12;
  undefined2 uVar13;
  
  lVar6 = 0;
  do {
    uVar8 = *(undefined4 *)(left + lVar6 * 4);
    uVar12 = (undefined1)((uint)uVar8 >> 0x18);
    uVar13 = CONCAT11(uVar12,uVar12);
    uVar12 = (undefined1)((uint)uVar8 >> 0x10);
    uVar2 = CONCAT35(CONCAT21(uVar13,uVar12),CONCAT14(uVar12,uVar8));
    uVar12 = (undefined1)((uint)uVar8 >> 8);
    uVar4 = CONCAT51(CONCAT41((int)((ulong)uVar2 >> 0x20),uVar12),uVar12);
    uVar7 = CONCAT11((char)uVar8,(char)uVar8);
    uVar3 = CONCAT62(uVar4,uVar7);
    auVar11._8_4_ = 0;
    auVar11._0_8_ = uVar3;
    auVar11._12_2_ = uVar13;
    auVar11._14_2_ = uVar13;
    uVar13 = (undefined2)((ulong)uVar2 >> 0x20);
    auVar10._12_4_ = auVar11._12_4_;
    auVar10._8_2_ = 0;
    auVar10._0_8_ = uVar3;
    auVar10._10_2_ = uVar13;
    auVar9._10_6_ = auVar10._10_6_;
    auVar9._8_2_ = uVar13;
    auVar9._0_8_ = uVar3;
    uVar13 = (undefined2)uVar4;
    auVar5._4_8_ = auVar9._8_8_;
    auVar5._2_2_ = uVar13;
    auVar5._0_2_ = uVar13;
    uVar8 = CONCAT22(uVar7,uVar7);
    uVar14 = auVar5._0_4_;
    uVar15 = auVar9._8_4_;
    *(undefined4 *)dst = uVar8;
    *(undefined4 *)(dst + 4) = uVar8;
    *(undefined4 *)(dst + 8) = uVar8;
    *(undefined4 *)(dst + 0xc) = uVar8;
    *(undefined4 *)(dst + 0x10) = uVar8;
    *(undefined4 *)(dst + 0x14) = uVar8;
    *(undefined4 *)(dst + 0x18) = uVar8;
    *(undefined4 *)(dst + 0x1c) = uVar8;
    *(undefined4 *)(dst + 0x20) = uVar8;
    *(undefined4 *)(dst + 0x24) = uVar8;
    *(undefined4 *)(dst + 0x28) = uVar8;
    *(undefined4 *)(dst + 0x2c) = uVar8;
    *(undefined4 *)(dst + 0x30) = uVar8;
    *(undefined4 *)(dst + 0x34) = uVar8;
    *(undefined4 *)(dst + 0x38) = uVar8;
    *(undefined4 *)(dst + 0x3c) = uVar8;
    puVar1 = dst + stride;
    *(undefined4 *)puVar1 = uVar14;
    *(undefined4 *)(puVar1 + 4) = uVar14;
    *(undefined4 *)(puVar1 + 8) = uVar14;
    *(undefined4 *)(puVar1 + 0xc) = uVar14;
    puVar1 = dst + stride + 0x10;
    *(undefined4 *)puVar1 = uVar14;
    *(undefined4 *)(puVar1 + 4) = uVar14;
    *(undefined4 *)(puVar1 + 8) = uVar14;
    *(undefined4 *)(puVar1 + 0xc) = uVar14;
    puVar1 = dst + stride + 0x20;
    *(undefined4 *)puVar1 = uVar14;
    *(undefined4 *)(puVar1 + 4) = uVar14;
    *(undefined4 *)(puVar1 + 8) = uVar14;
    *(undefined4 *)(puVar1 + 0xc) = uVar14;
    puVar1 = dst + stride + 0x30;
    *(undefined4 *)puVar1 = uVar14;
    *(undefined4 *)(puVar1 + 4) = uVar14;
    *(undefined4 *)(puVar1 + 8) = uVar14;
    *(undefined4 *)(puVar1 + 0xc) = uVar14;
    puVar1 = dst + stride * 2;
    *(undefined4 *)puVar1 = uVar15;
    *(undefined4 *)(puVar1 + 4) = uVar15;
    *(undefined4 *)(puVar1 + 8) = uVar15;
    *(undefined4 *)(puVar1 + 0xc) = uVar15;
    puVar1 = dst + stride * 2 + 0x10;
    *(undefined4 *)puVar1 = uVar15;
    *(undefined4 *)(puVar1 + 4) = uVar15;
    *(undefined4 *)(puVar1 + 8) = uVar15;
    *(undefined4 *)(puVar1 + 0xc) = uVar15;
    puVar1 = dst + stride * 2 + 0x20;
    *(undefined4 *)puVar1 = uVar15;
    *(undefined4 *)(puVar1 + 4) = uVar15;
    *(undefined4 *)(puVar1 + 8) = uVar15;
    *(undefined4 *)(puVar1 + 0xc) = uVar15;
    puVar1 = dst + stride * 2 + 0x30;
    *(undefined4 *)puVar1 = uVar15;
    *(undefined4 *)(puVar1 + 4) = uVar15;
    *(undefined4 *)(puVar1 + 8) = uVar15;
    *(undefined4 *)(puVar1 + 0xc) = uVar15;
    puVar1 = dst + stride * 3;
    *(undefined4 *)puVar1 = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 4) = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 8) = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 0xc) = auVar10._12_4_;
    puVar1 = dst + stride * 3 + 0x10;
    *(undefined4 *)puVar1 = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 4) = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 8) = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 0xc) = auVar10._12_4_;
    puVar1 = dst + stride * 3 + 0x20;
    *(undefined4 *)puVar1 = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 4) = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 8) = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 0xc) = auVar10._12_4_;
    puVar1 = dst + stride * 3 + 0x30;
    *(undefined4 *)puVar1 = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 4) = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 8) = auVar10._12_4_;
    *(undefined4 *)(puVar1 + 0xc) = auVar10._12_4_;
    lVar6 = lVar6 + 1;
    dst = dst + stride * 4;
  } while ((int)lVar6 != 8);
  return;
}

Assistant:

void aom_h_predictor_64x32_sse2(uint8_t *dst, ptrdiff_t stride,
                                const uint8_t *above, const uint8_t *left) {
  (void)above;
  h_predictor_64xh(dst, stride, left, 32);
}